

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

SplittingStepCoefficients SplittingStepCoefficients_SymmetricParallel(int partitions)

{
  int in_EDI;
  int unaff_retaddr;
  int j;
  int i;
  SplittingStepCoefficients coefficients;
  int local_20;
  int local_1c;
  SplittingStepCoefficients local_8;
  
  local_8 = SplittingStepCoefficients_Alloc(i,j,unaff_retaddr);
  if (local_8 == (SplittingStepCoefficients)0x0) {
    local_8 = (SplittingStepCoefficients)0x0;
  }
  else {
    local_8->order = 2;
    *local_8->alpha = 0.5;
    local_8->alpha[1] = 0.5;
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      (*local_8->beta)[in_EDI][local_1c] = 1.0;
      for (local_20 = (in_EDI - local_1c) + -1; local_20 < in_EDI; local_20 = local_20 + 1) {
        local_8->beta[1][local_1c + 1][local_20] = 1.0;
      }
    }
  }
  return local_8;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_SymmetricParallel(
  const int partitions)
{
  const SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(2, partitions, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order    = 2;
  coefficients->alpha[0] = SUN_RCONST(0.5);
  coefficients->alpha[1] = SUN_RCONST(0.5);

  for (int i = 0; i < partitions; i++)
  {
    coefficients->beta[0][partitions][i] = SUN_RCONST(1.0);
    for (int j = partitions - i - 1; j < partitions; j++)
    {
      coefficients->beta[1][i + 1][j] = SUN_RCONST(1.0);
    }
  }

  return coefficients;
}